

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O1

error<idx2::mmap_err_code> idx2::SyncFile(mmap_file *MMap)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  long *in_FS_OFFSET;
  bool bVar4;
  error<idx2::mmap_err_code> eVar5;
  
  iVar2 = msync((MMap->Buf).Data,(MMap->Buf).Bytes,4);
  lVar1 = *in_FS_OFFSET;
  bVar4 = iVar2 != -1;
  *(char **)(*in_FS_OFFSET + -0x480) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/MemoryMap.cpp"
  ;
  *(uint *)(lVar1 + -0x280) = bVar4 + 0x9c + (uint)bVar4;
  uVar3 = 0x19;
  if (bVar4) {
    uVar3 = 0;
  }
  eVar5.Code = (int)uVar3;
  eVar5.StackIdx = (char)((ulong)uVar3 >> 0x20);
  eVar5.StrGened = (bool)(char)((ulong)uVar3 >> 0x28);
  eVar5._14_2_ = (short)((ulong)uVar3 >> 0x30);
  eVar5.Msg = "";
  return eVar5;
}

Assistant:

error<mmap_err_code>
SyncFile(mmap_file* MMap)
{
#if defined(_WIN32)
  if (!FlushFileBuffers(MMap->File))
    return idx2_Error(mmap_err_code::SyncFailed);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  if (msync(MMap->Buf.Data, MMap->Buf.Bytes, MS_SYNC) == -1)
    return idx2_Error(mmap_err_code::SyncFailed);
#endif
  return idx2_Error(mmap_err_code::NoError);
}